

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,texcoord3f *value)

{
  bool bVar1;
  float3 v;
  array<float,_3UL> local_14;
  
  bVar1 = ParseBasicTypeTuple<float,3ul>(this,&local_14);
  if (bVar1) {
    value->s = local_14._M_elems[0];
    value->t = local_14._M_elems[1];
    value->r = local_14._M_elems[2];
  }
  return true;
}

Assistant:

bool AsciiParser::ReadBasicType(value::texcoord3f *value) {

  value::float3 v;
  if (ParseBasicTypeTuple(&v)) {
    value->s = v[0];
    value->t = v[1];
    value->r = v[2];
    return true;
  }

  return true;
}